

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_op.hpp
# Opt level: O3

want __thiscall
asio::ssl::detail::write_op<asio::const_buffers_1>::operator()
          (write_op<asio::const_buffers_1> *this,engine *eng,error_code *ec,
          size_t *bytes_transferred)

{
  error_code *ec_00;
  want wVar1;
  error_category *peVar2;
  
  ec_00 = (error_code *)(this->buffers_).super_const_buffer.size_;
  if (ec_00 == (error_code *)0x0) {
    peVar2 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar2;
    wVar1 = want_nothing;
  }
  else {
    wVar1 = engine::perform(eng,0x1f06b0,(void *)0x0,
                            (size_t)(this->buffers_).super_const_buffer.data_,ec_00,(size_t *)ec);
  }
  return wVar1;
}

Assistant:

engine::want operator()(engine& eng,
      asio::error_code& ec,
      std::size_t& bytes_transferred) const
  {
    unsigned char storage[
      asio::detail::buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence>::linearisation_storage_size];

    asio::const_buffer buffer =
      asio::detail::buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence>::linearise(buffers_, asio::buffer(storage));

    return eng.write(buffer, ec, bytes_transferred);
  }